

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::
Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_bool,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doPrintExpr(Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_bool,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
              *this,ostream *os)

{
  BaseArgExprs args;
  ExprBase *local_30;
  void *local_28;
  undefined8 uStack_20;
  long local_18;
  
  local_28 = (void *)0x0;
  uStack_20 = 0;
  local_18 = 0;
  local_30 = &((this->m_args).a.super_ExprPBase<bool>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>.m_ptr)->
              super_ExprBase;
  std::
  vector<deqp::gls::BuiltinPrecisionTests::ExprBase_const*,std::allocator<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>>
  ::emplace_back<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>
            ((vector<deqp::gls::BuiltinPrecisionTests::ExprBase_const*,std::allocator<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>>
              *)&local_28,&local_30);
  local_30 = &((this->m_args).b.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_ptr)->super_ExprBase;
  std::
  vector<deqp::gls::BuiltinPrecisionTests::ExprBase_const*,std::allocator<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>>
  ::emplace_back<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>
            ((vector<deqp::gls::BuiltinPrecisionTests::ExprBase_const*,std::allocator<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>>
              *)&local_28,&local_30);
  local_30 = &((this->m_args).c.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_ptr)->super_ExprBase;
  std::
  vector<deqp::gls::BuiltinPrecisionTests::ExprBase_const*,std::allocator<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>>
  ::emplace_back<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>
            ((vector<deqp::gls::BuiltinPrecisionTests::ExprBase_const*,std::allocator<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>>
              *)&local_28,&local_30);
  local_30 = &((this->m_args).d.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
               super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
              .m_ptr)->super_ExprBase;
  std::
  vector<deqp::gls::BuiltinPrecisionTests::ExprBase_const*,std::allocator<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>>
  ::emplace_back<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>
            ((vector<deqp::gls::BuiltinPrecisionTests::ExprBase_const*,std::allocator<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>>
              *)&local_28,&local_30);
  (**(code **)(*(long *)this->m_func + 0x20))(this->m_func,os,&local_28);
  if (local_28 != (void *)0x0) {
    operator_delete(local_28,local_18 - (long)local_28);
  }
  return;
}

Assistant:

void				doPrintExpr			(ostream& os) const
	{
		BaseArgExprs	args;
		args.push_back(m_args.a.get());
		args.push_back(m_args.b.get());
		args.push_back(m_args.c.get());
		args.push_back(m_args.d.get());
		m_func.print(os, args);
	}